

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<absl::lts_20250127::Cord>::~RepeatedField
          (RepeatedField<absl::lts_20250127::Cord> *this)

{
  ulong uVar1;
  uint uVar2;
  ThreadSafeArena *this_00;
  HeapRep *pHVar3;
  Cord *this_01;
  long lVar4;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  if ((uVar1 & 4) == 0) {
    this_00 = &internal::SooRep::soo_arena(&this->soo_rep_)->impl_;
  }
  else {
    pHVar3 = heap_rep(this);
    this_00 = &((pHVar3->field_0).arena)->impl_;
  }
  if (this_00 != (ThreadSafeArena *)0x0) {
    internal::ThreadSafeArena::SpaceAllocated(this_00);
  }
  uVar2 = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
  if (0 < (int)uVar2) {
    if ((uVar1 & 4) == 0) {
      this_01 = (Cord *)((long)&(this->soo_rep_).field_0 + 8);
    }
    else {
      this_01 = (Cord *)internal::LongSooRep::elements((LongSooRep *)this);
    }
    lVar4 = (ulong)uVar2 << 4;
    do {
      absl::lts_20250127::Cord::~Cord(this_01);
      this_01 = this_01 + 1;
      lVar4 = lVar4 + -0x10;
    } while (lVar4 != 0);
  }
  UnpoisonBuffer(this);
  if ((uVar1 & 4) != 0) {
    InternalDeallocate<true>(this);
  }
  return;
}

Assistant:

RepeatedField<Element>::~RepeatedField() {
  StaticValidityCheck();
  const bool is_soo = this->is_soo();
#ifndef NDEBUG
  // Try to trigger segfault / asan failure in non-opt builds if arena_
  // lifetime has ended before the destructor.
  auto arena = GetArena(is_soo);
  if (arena) (void)arena->SpaceAllocated();
#endif
  const int size = this->size(is_soo);
  if (size > 0) {
    Element* elem = unsafe_elements(is_soo);
    Destroy(elem, elem + size);
  }
  UnpoisonBuffer();
  if (!is_soo) InternalDeallocate<true>();
}